

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

MPP_RET mpp_service_reg_offsets(void *ctx,MppDevRegOffCfgs *cfgs)

{
  MppDevRegOffCfgs *pMVar1;
  uint *puVar2;
  RegOffsetInfo *pRVar3;
  int local_44;
  RK_S32 j;
  MppDevRegOffsetCfg *cfg;
  RK_S32 i;
  RegOffsetInfo *info;
  MppDevMppService *p;
  MppDevRegOffCfgs *cfgs_local;
  void *ctx_local;
  
  if (cfgs->count < 1) {
    ctx_local._4_4_ = MPP_OK;
  }
  else if ((*(int *)((long)ctx + 0x44) < 0x40) && (*(int *)((long)ctx + 0x44) + cfgs->count < 0x40))
  {
    for (cfg._4_4_ = 0; cfg._4_4_ < cfgs->count; cfg._4_4_ = cfg._4_4_ + 1) {
      pMVar1 = cfgs + (long)cfg._4_4_ + 1;
      for (local_44 = 0; local_44 < *(int *)((long)ctx + 0x44); local_44 = local_44 + 1) {
        puVar2 = (uint *)(*(long *)((long)ctx + 0x38) +
                         (long)(*(int *)((long)ctx + 0x48) + local_44) * 8);
        if (*puVar2 == pMVar1->size) {
          _mpp_log_l(2,"mpp_serivce","reg[%d] offset has been set, cover old %d -> %d\n",
                     "mpp_service_reg_offsets",(ulong)*puVar2,(ulong)puVar2[1],pMVar1->count);
          puVar2[1] = pMVar1->count;
        }
      }
      pRVar3 = mpp_service_next_reg_offset((MppDevMppService *)ctx);
      pRVar3->reg_idx = pMVar1->size;
      pRVar3->offset = pMVar1->count;
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_reg_offsets",0x40);
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_service_reg_offsets(void *ctx, MppDevRegOffCfgs *cfgs)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    RegOffsetInfo *info;
    RK_S32 i;

    if (cfgs->count <= 0)
        return MPP_OK;

    if (p->reg_offset_count >= MAX_REG_OFFSET ||
        p->reg_offset_count + cfgs->count >= MAX_REG_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_REG_OFFSET);
        return MPP_NOK;
    }

    for (i = 0; i < cfgs->count; i++) {
        MppDevRegOffsetCfg *cfg = &cfgs->cfgs[i];
        RK_S32 j;

        for (j = 0; j < p->reg_offset_count; j++) {
            info = &p->reg_offset_info[p->reg_offset_pos + j];

            if (info->reg_idx == cfg->reg_idx) {
                mpp_err_f("reg[%d] offset has been set, cover old %d -> %d\n",
                          info->reg_idx, info->offset, cfg->offset);
                info->offset = cfg->offset;
                continue;
            }
        }

        info = mpp_service_next_reg_offset(p);;
        info->reg_idx = cfg->reg_idx;
        info->offset = cfg->offset;
    }

    return MPP_OK;
}